

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

Any * __thiscall chaiscript::detail::Any::operator=(Any *this,Any *t_any)

{
  Any local_20;
  Any copy;
  Any *t_any_local;
  Any *this_local;
  
  copy.m_data._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       (unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
        )(unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
          )t_any;
  Any(&local_20,t_any);
  swap(this,&local_20);
  ~Any(&local_20);
  return this;
}

Assistant:

Any &operator=(const Any &t_any) {
        Any copy(t_any);
        swap(copy);
        return *this;
      }